

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O3

void number_suite::output_int16(void)

{
  bool bVar1;
  size_type sVar2;
  bool result;
  value_type input [3];
  reader reader;
  double local_b8;
  value local_b0 [9];
  uchar local_8c [4];
  reader local_88;
  
  local_8c[2] = '\x01';
  local_8c[0] = 0xb2;
  local_8c[1] = '\0';
  trial::protocol::bintoken::reader::reader<unsigned_char[3]>(&local_88,(uchar (*) [3])local_8c);
  sVar2 = trial::protocol::bintoken::reader::length(&local_88);
  boost::detail::test_impl
            ("reader.length() == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x171,"void number_suite::output_int16()",sVar2 == 1);
  local_b8._0_1_ = 1;
  trial::protocol::bintoken::reader::overloader<bool,_void>::convert(&local_88,(bool *)&local_b8,1);
  boost::detail::throw_failed_impl
            ("reader.array(&result, 1)","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x175,"void number_suite::output_int16()");
  local_b8 = (double)CONCAT71(local_b8._1_7_,0x7f);
  trial::protocol::bintoken::reader::overloader<signed_char,_void>::convert
            (&local_88,(char *)&local_b8,1);
  boost::detail::throw_failed_impl
            ("reader.array(&result, 1)","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x17a,"void number_suite::output_int16()");
  local_b8 = (double)CONCAT62(local_b8._2_6_,0x7fff);
  trial::protocol::bintoken::reader::overloader<short,_void>::convert
            (&local_88,(short *)&local_b8,1);
  local_b0[0] = 0x100;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,int>
            ("result","INT16_C(0x0100)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x17f,"void number_suite::output_int16()",&local_b8,local_b0);
  local_b8 = (double)CONCAT44(local_b8._4_4_,0x7fffffff);
  trial::protocol::bintoken::reader::overloader<int,_void>::convert(&local_88,(int *)&local_b8,1);
  boost::detail::throw_failed_impl
            ("reader.array(&result, 1)","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x184,"void number_suite::output_int16()");
  local_b8 = NAN;
  trial::protocol::bintoken::reader::overloader<long,_void>::convert(&local_88,(long *)&local_b8,1);
  boost::detail::throw_failed_impl
            ("reader.array(&result, 1)","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x189,"void number_suite::output_int16()");
  local_b8 = (double)CONCAT44(local_b8._4_4_,0x7f7fffff);
  trial::protocol::bintoken::reader::overloader<float,_void>::convert
            (&local_88,(float *)&local_b8,1);
  boost::detail::throw_failed_impl
            ("reader.array(&result, 1)","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x18e,"void number_suite::output_int16()");
  local_b8 = 1.79769313486232e+308;
  trial::protocol::bintoken::reader::overloader<double,_void>::convert(&local_88,&local_b8,1);
  boost::detail::throw_failed_impl
            ("reader.array(&result, 1)","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x193,"void number_suite::output_int16()");
  bVar1 = trial::protocol::bintoken::reader::next(&local_88);
  local_b0[0] = CONCAT31(local_b0[0]._1_3_,bVar1);
  local_b8 = (double)((ulong)local_b8 & 0xffffffffffffff00);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x195,"void number_suite::output_int16()",local_b0,&local_b8);
  local_b0[0] = local_88.decoder.current.code;
  local_b8 = (double)((ulong)local_b8 & 0xffffffff00000000);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x196,"void number_suite::output_int16()",local_b0,&local_b8);
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)&local_88.stack);
  return;
}

Assistant:

void output_int16()
{
    const value_type input[] = { token::code::int16, 0x00, 0x01 };
    format::reader reader(input);
    TRIAL_PROTOCOL_TEST(reader.length() == 1);
    {
        auto result = std::numeric_limits<token::boolean::type>::max();
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.array(&result, 1),
                                        format::error, "incompatible type");
    }
    {
        auto result = std::numeric_limits<token::int8::type>::max();
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.array(&result, 1),
                                        format::error, "invalid value");
    }
    {
        auto result = std::numeric_limits<token::int16::type>::max();
        TRIAL_PROTOCOL_TEST_NO_THROW(reader.array(&result, 1));
        TRIAL_PROTOCOL_TEST_EQUAL(result, INT16_C(0x0100));
    }
    {
        auto result = std::numeric_limits<token::int32::type>::max();
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.array(&result, 1),
                                        format::error, "invalid value");
    }
    {
        auto result = std::numeric_limits<token::int64::type>::max();
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.array(&result, 1),
                                        format::error, "invalid value");
    }
    {
        auto result = std::numeric_limits<token::float32::type>::max();
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.array(&result, 1),
                                        format::error, "invalid value");
    }
    {
        auto result = std::numeric_limits<token::float64::type>::max();
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.array(&result, 1),
                                        format::error, "invalid value");
    }
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}